

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O2

uint32_t __thiscall basist::bitwise_decoder::get_bits(bitwise_decoder *this,uint32_t num_bits)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t num_bits_00;
  
  if (num_bits < 0x1a) {
    uVar3 = peek_bits(this,num_bits);
    this->m_bit_buf = this->m_bit_buf >> ((byte)num_bits & 0x1f);
    this->m_bit_buf_size = this->m_bit_buf_size - num_bits;
  }
  else {
    if (0x20 < num_bits) {
      __assert_fail("num_bits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder_internal.h"
                    ,0x160,"uint32_t basist::bitwise_decoder::get_bits(uint32_t)");
    }
    uVar1 = peek_bits(this,0x19);
    this->m_bit_buf = this->m_bit_buf >> 0x19;
    this->m_bit_buf_size = this->m_bit_buf_size - 0x19;
    num_bits_00 = num_bits - 0x19;
    uVar2 = peek_bits(this,num_bits_00);
    this->m_bit_buf = this->m_bit_buf >> ((byte)num_bits_00 & 0x1f);
    this->m_bit_buf_size = this->m_bit_buf_size - num_bits_00;
    uVar3 = uVar2 << 0x19 | uVar1;
  }
  return uVar3;
}

Assistant:

uint32_t get_bits(uint32_t num_bits)
		{
			if (num_bits > 25)
			{
				assert(num_bits <= 32);

				const uint32_t bits0 = peek_bits(25);
				m_bit_buf >>= 25;
				m_bit_buf_size -= 25;
				num_bits -= 25;

				const uint32_t bits = peek_bits(num_bits);
				m_bit_buf >>= num_bits;
				m_bit_buf_size -= num_bits;

				return bits0 | (bits << 25);
			}

			const uint32_t bits = peek_bits(num_bits);

			m_bit_buf >>= num_bits;
			m_bit_buf_size -= num_bits;

			return bits;
		}